

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O3

void __thiscall Hpipe::CbString::CbString(CbString *this,CbStringPtr *bs,PT b_off,PT b_len)

{
  Buffer *b;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Buffer *pBVar4;
  PT sd;
  Buffer *pBVar5;
  ulong uVar6;
  PT sd_1;
  ulong local_28;
  anon_class_24_3_09656f79 local_20;
  
  local_20.b_off = &local_28;
  this->beg = (Buffer *)0x0;
  this->off = 0;
  this->end = 0;
  if (b_len != 0) {
    uVar2 = bs->off;
    uVar6 = bs->end;
    if (uVar2 < uVar6) {
      pBVar4 = bs->beg;
      uVar3 = pBVar4->used;
      uVar1 = uVar6 - uVar3;
      if (uVar6 < uVar3 || uVar1 == 0) {
        if (b_off < uVar6 - uVar2) {
          pBVar4->cpt_use = pBVar4->cpt_use + 1;
          this->beg = pBVar4;
          this->off = uVar2 + b_off;
          this->end = uVar2 + b_off + b_len;
        }
      }
      else {
        pBVar5 = pBVar4->next;
        uVar3 = uVar3 - uVar2;
        uVar6 = b_off - uVar3;
        if (b_off < uVar3) {
          pBVar4->cpt_use = pBVar4->cpt_use + 1;
          this->beg = pBVar4;
          this->off = uVar2 + b_off;
          this->end = uVar2 + b_off + b_len;
          if (b_off + b_len <= uVar3) {
            return;
          }
          uVar6 = 0;
        }
        else {
          pBVar4 = (Buffer *)0x0;
        }
        if (pBVar5 != (Buffer *)0x0) {
          uVar2 = pBVar5->used;
          if (uVar2 < uVar1) {
            do {
              b = pBVar5->next;
              local_28 = uVar6 - uVar2;
              if (uVar6 < uVar2) {
                pBVar5->cpt_use = pBVar5->cpt_use + 1;
                if (pBVar4 == (Buffer *)0x0) {
                  this->beg = pBVar5;
                  this->off = uVar6;
                  this->end = uVar6 + b_len;
                  pBVar4 = pBVar5;
                }
                if (uVar6 + b_len <= uVar2) {
                  return;
                }
                local_28 = 0;
              }
              uVar2 = uVar1 - uVar2;
              uVar3 = b->used;
              uVar1 = uVar2 - uVar3;
              if (uVar2 < uVar3 || uVar1 == 0) {
                local_20.this = this;
                local_20.b_len = b_len;
                CbString::anon_class_24_3_09656f79::operator()(&local_20,b,0,uVar2);
                return;
              }
              pBVar5 = b->next;
              uVar6 = local_28 - uVar3;
              if (local_28 < uVar3) {
                b->cpt_use = b->cpt_use + 1;
                if (pBVar4 == (Buffer *)0x0) {
                  this->beg = b;
                  this->off = local_28;
                  this->end = local_28 + b_len;
                  pBVar4 = b;
                }
                if (local_28 + b_len <= uVar3) {
                  return;
                }
                uVar6 = 0;
              }
              uVar2 = pBVar5->used;
            } while (uVar2 < uVar1);
          }
          if ((uVar6 < uVar1) && (pBVar5->cpt_use = pBVar5->cpt_use + 1, pBVar4 == (Buffer *)0x0)) {
            this->beg = pBVar5;
            this->off = uVar6;
            this->end = b_len + uVar6;
          }
        }
      }
    }
  }
  return;
}

Assistant:

CbString::CbString( const CbStringPtr &bs, PT b_off, PT b_len ) : beg( 0 ), off( 0 ), end( 0 ) {
    if ( not b_len )
        return;
    bs.visitor( [ this, &b_off, b_len ]( const Buffer *b, PT bd, PT ed ) {
        PT sd = ed - bd;
        // we have to take this buffer ?
        if ( b_off < sd ) {
            Buffer::inc_ref( b );

            // first buffer in this ?
            if ( not beg ) {
                beg = b;
                off = bd + b_off;
                end = off + b_len;
            }

            // that was the last buffer ?
            if ( b_off + b_len <= sd )
                return false;
            b_off = 0;
        } else
            b_off -= sd;
        return true;
    } );
}